

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineReferenceRenderer.cpp
# Opt level: O0

TestFunc vkt::pipeline::mapVkCompareOp(VkCompareOp compareFunc)

{
  TestFunc local_c;
  VkCompareOp compareFunc_local;
  
  switch(compareFunc) {
  case VK_COMPARE_OP_NEVER:
    local_c = TESTFUNC_NEVER;
    break;
  case VK_COMPARE_OP_LESS:
    local_c = TESTFUNC_LESS;
    break;
  case VK_COMPARE_OP_EQUAL:
    local_c = TESTFUNC_EQUAL;
    break;
  case VK_COMPARE_OP_LESS_OR_EQUAL:
    local_c = TESTFUNC_LEQUAL;
    break;
  case VK_COMPARE_OP_GREATER:
    local_c = TESTFUNC_GREATER;
    break;
  case VK_COMPARE_OP_NOT_EQUAL:
    local_c = TESTFUNC_NOTEQUAL;
    break;
  case VK_COMPARE_OP_GREATER_OR_EQUAL:
    local_c = TESTFUNC_GEQUAL;
    break;
  case VK_COMPARE_OP_ALWAYS:
    local_c = TESTFUNC_ALWAYS;
    break;
  default:
    local_c = TESTFUNC_LAST;
  }
  return local_c;
}

Assistant:

rr::TestFunc mapVkCompareOp (VkCompareOp compareFunc)
{
	switch (compareFunc)
	{
		case VK_COMPARE_OP_NEVER:				return rr::TESTFUNC_NEVER;
		case VK_COMPARE_OP_LESS:				return rr::TESTFUNC_LESS;
		case VK_COMPARE_OP_EQUAL:				return rr::TESTFUNC_EQUAL;
		case VK_COMPARE_OP_LESS_OR_EQUAL:		return rr::TESTFUNC_LEQUAL;
		case VK_COMPARE_OP_GREATER:				return rr::TESTFUNC_GREATER;
		case VK_COMPARE_OP_NOT_EQUAL:			return rr::TESTFUNC_NOTEQUAL;
		case VK_COMPARE_OP_GREATER_OR_EQUAL:	return rr::TESTFUNC_GEQUAL;
		case VK_COMPARE_OP_ALWAYS:				return rr::TESTFUNC_ALWAYS;
		default:
			DE_ASSERT(false);
	}
	return rr::TESTFUNC_LAST;
}